

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kinFerTron_dns.c
# Opt level: O3

int func(N_Vector u,N_Vector f,void *user_data)

{
  double dVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  double dVar5;
  double dVar6;
  double *pdVar7;
  double *pdVar8;
  double dVar9;
  
  pdVar7 = (double *)N_VGetArrayPointer();
  pdVar8 = (double *)N_VGetArrayPointer(f);
  dVar1 = *pdVar7;
  dVar2 = pdVar7[1];
  dVar3 = pdVar7[2];
  dVar4 = pdVar7[3];
  dVar5 = pdVar7[4];
  dVar6 = pdVar7[5];
  dVar9 = sin(dVar1 * dVar2);
  *pdVar8 = dVar1 * -0.5 + dVar9 * 0.5 + (dVar2 * 0.25) / -3.1415926;
  dVar9 = exp(dVar1 + dVar1);
  pdVar8[1] = dVar1 * -5.4365636 +
              (dVar9 + -2.7182818) * 0.920422527096607 + (dVar2 * 2.7182818) / 3.1415926;
  pdVar8[2] = (dVar3 - dVar1) + *user_data;
  pdVar8[3] = (dVar4 - dVar1) + *(double *)((long)user_data + 0x10);
  pdVar8[4] = (dVar5 - dVar2) + *(double *)((long)user_data + 8);
  pdVar8[5] = (dVar6 - dVar2) + *(double *)((long)user_data + 0x18);
  return 0;
}

Assistant:

static int func(N_Vector u, N_Vector f, void* user_data)
{
  sunrealtype *udata, *fdata;
  sunrealtype x1, l1, L1, x2, l2, L2;
  sunrealtype *lb, *ub;
  UserData data;

  data = (UserData)user_data;
  lb   = data->lb;
  ub   = data->ub;

  udata = N_VGetArrayPointer(u);
  fdata = N_VGetArrayPointer(f);

  x1 = udata[0];
  x2 = udata[1];
  l1 = udata[2];
  L1 = udata[3];
  l2 = udata[4];
  L2 = udata[5];

  fdata[0] = PT5 * sin(x1 * x2) - PT25 * x2 / PI - PT5 * x1;
  fdata[1] = (ONE - PT25 / PI) * (exp(TWO * x1) - E) + E * x2 / PI - TWO * E * x1;
  fdata[2] = l1 - x1 + lb[0];
  fdata[3] = L1 - x1 + ub[0];
  fdata[4] = l2 - x2 + lb[1];
  fdata[5] = L2 - x2 + ub[1];

  return (0);
}